

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbscreen.cpp
# Opt level: O2

void formatRect(QDebug *debug,QRect r)

{
  QDebug *pQVar1;
  
  pQVar1 = QDebug::operator<<(debug,(r.x2.m_i.m_i - r.x1.m_i) + 1);
  pQVar1 = QDebug::operator<<(pQVar1,'x');
  pQVar1 = QDebug::operator<<(pQVar1,(r.y2.m_i.m_i - r.y1.m_i) + 1);
  Qt::forcesign((QTextStream *)pQVar1->stream);
  pQVar1 = QDebug::operator<<(pQVar1,r.x1.m_i.m_i);
  pQVar1 = QDebug::operator<<(pQVar1,r.y1.m_i.m_i);
  Qt::noforcesign((QTextStream *)pQVar1->stream);
  return;
}

Assistant:

static inline void formatRect(QDebug &debug, const QRect r)
{
    debug << r.width() << 'x' << r.height()
        << Qt::forcesign << r.x() << r.y() << Qt::noforcesign;
}